

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-kalman-filter.cpp
# Opt level: O2

double testKalmanFilterZeroInput(void)

{
  Scalar SVar1;
  undefined1 auVar2 [16];
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *pCVar3;
  long lVar4;
  Scalar *pSVar5;
  Scalar *pSVar6;
  uint uVar7;
  long lVar8;
  ulong index;
  result_type rVar9;
  RealScalar RVar10;
  StateVector error;
  StateVector xh;
  StateVector x;
  StateVector v;
  Pmatrix p;
  Rmatrix r;
  MeasureVector *local_a950;
  void *local_a940 [2];
  Qmatrix q1;
  Qmatrix q;
  InputVector u;
  Cmatrix c;
  Rmatrix r1;
  Dmatrix d;
  Bmatrix b;
  filter f;
  Matrix<double,_4,_4,_0,_4,_4> a;
  StateVector xk [1001];
  lagged_fibonacci1279 gen_;
  MeasureVector yk [1000];
  
  p.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       (Index)p.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
  stateObservation::LinearKalmanFilter::LinearKalmanFilter(&f,4,3,0);
  xk[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)&a;
  xk[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  xk[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x1;
  xk[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 1;
  a.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       -0.6785714;
  yk[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x3fbd9afef4674589;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)xk,(Scalar *)yk);
  gen_.i = 0x298d9804;
  gen_._4_4_ = 0x3fdc1cb3;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar3,(Scalar *)&gen_);
  p.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x3fd2544a04301069;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar3,(Scalar *)&p);
  b.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x3fb626de911a6f17;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar3,(Scalar *)&b);
  c.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0xbf9c09c3ce2089e3;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar3,(Scalar *)&c);
  d.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x3fd578ffc61e5ce2;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar3,(Scalar *)&d);
  r1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x3f92db61bb05faec;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar3,(Scalar *)&r1);
  q1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0xbfdab4b28f33e50a;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar3,(Scalar *)&q1);
  r.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0xbfca11f926c7eae6;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar3,(Scalar *)&r);
  q.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0xbfdc60b044000a11;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar3,(Scalar *)&q);
  v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0xbfd1111134dba9df;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar3,(Scalar *)&v);
  x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x3fdae264e48626f6;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar3,(Scalar *)&x);
  u.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x3fe13d1782d38477;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar3,(Scalar *)&u);
  xh.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x3fdf4168eb7be47d;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar3,(Scalar *)&xh);
  error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0xbfe3280cf9e3864d;
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_(pCVar3,(Scalar *)&error)
  ;
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)xk);
  stateObservation::LinearKalmanFilter::getBmatrixRandom();
  stateObservation::KalmanFilterBase::getCmatrixRandom();
  stateObservation::LinearKalmanFilter::getDmatrixRandom();
  memset(xk,0,0x3e90);
  local_a950 = yk;
  memset(local_a950,0,16000);
  stateObservation::ObserverBase::stateVectorZero();
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>(xk,&x);
  boost::random::lagged_fibonacci_01_engine<double,_48,_1279U,_418U>::seed(&gen_);
  stateObservation::KalmanFilterBase::getRmatrixRandom();
  r.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x3f847ae147ae147b;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
            ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&p,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&q1,(double *)&r);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&r1,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)&p);
  free(q1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  stateObservation::KalmanFilterBase::getQmatrixRandom();
  q.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x3f847ae147ae147b;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
            ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&p,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&r,(double *)&q);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&q1,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)&p);
  free(r.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  q.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)&r1;
  p.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage._0_16_ =
       Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                 ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&r1,
                  (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)&q);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&r,
             (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
              *)&p);
  v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = (double *)&q1;
  p.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage._0_16_ =
       Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                 ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&q1,
                  (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)&v);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&q,
             (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
              *)&p);
  stateObservation::ObserverBase::inputVectorZero();
  for (lVar8 = 1; lVar8 != 0x3e9; lVar8 = lVar8 + 1) {
    stateObservation::ObserverBase::stateVectorZero();
    uVar7 = 0;
    while( true ) {
      lVar4 = stateObservation::ObserverBase::getStateSize();
      if (lVar4 <= (long)(ulong)uVar7) break;
      xh.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)0x0;
      error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)0x3ff0000000000000;
      boost::random::normal_distribution<double>::normal_distribution
                ((normal_distribution<double> *)&p,(double *)&xh,(double *)&error);
      rVar9 = boost::random::normal_distribution<double>::operator()
                        ((normal_distribution<double> *)&p,&gen_);
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&v,
                          (ulong)uVar7);
      *pSVar5 = rVar9;
      uVar7 = uVar7 + 1;
    }
    p.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage._0_16_ =
         Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                   ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&q1,
                    (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&v);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)&v,
               (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                *)&p);
    stateObservation::ObserverBase::measureVectorZero();
    uVar7 = 0;
    while( true ) {
      lVar4 = stateObservation::ObserverBase::getMeasureSize();
      if (lVar4 <= (long)(ulong)uVar7) break;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows;
      error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage =
           (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)(auVar2 << 0x40);
      local_a940[0] = (void *)0x3ff0000000000000;
      boost::random::normal_distribution<double>::normal_distribution
                ((normal_distribution<double> *)&p,(double *)&error,(double *)local_a940);
      rVar9 = boost::random::normal_distribution<double>::operator()
                        ((normal_distribution<double> *)&p,&gen_);
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&xh,
                          (ulong)uVar7);
      *pSVar5 = rVar9;
      uVar7 = uVar7 + 1;
    }
    p.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage._0_16_ =
         Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                   ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&r1,
                    (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&xh);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)&xh,
               (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                *)&p);
    error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage =
         (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
         Eigen::MatrixBase<Eigen::Matrix<double,4,4,0,4,4>>::operator*
                   ((MatrixBase<Eigen::Matrix<double,4,4,0,4,4>> *)&a,
                    (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&x);
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Matrix<double,-1,1,0,-1,1>,0>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                 *)&p,(MatrixBase<Eigen::Product<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                       *)&error,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&v);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              (&x,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                   *)&p);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
              (xk + lVar8,&x);
    error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage =
         (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
         Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                   ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&c,
                    (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&x);
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,0>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                 *)&p,(MatrixBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                       *)&error,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&xh);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              (yk + lVar8 + -1,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                *)&p);
    free(xh.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    free(v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  }
  stateObservation::ObserverBase::stateVectorRandom();
  stateObservation::ZeroDelayObserver::setState((Matrix *)&f,(long)&xh);
  stateObservation::KalmanFilterBase::getPmatrixZero();
  uVar7 = 0;
  while( true ) {
    lVar8 = stateObservation::ObserverBase::getStateSize();
    index = (ulong)uVar7;
    if (lVar8 <= (long)index) break;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&xh,index);
    SVar1 = *pSVar5;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&p,index,
                        index);
    *pSVar6 = SVar1;
    uVar7 = uVar7 + 1;
  }
  error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)&p;
  v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage =
       (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
       Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                 ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&p,
                  (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)&error
                 );
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
            (&p,(Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
                 *)&v);
  stateObservation::KalmanFilterBase::setStateCovariance((Matrix *)&f);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&v,
             (DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&a);
  stateObservation::KalmanFilterBase::setA((Matrix *)&f);
  free(v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  stateObservation::LinearKalmanFilter::setB((Matrix *)&f);
  stateObservation::KalmanFilterBase::setC((Matrix *)&f);
  stateObservation::LinearKalmanFilter::setD((Matrix *)&f);
  stateObservation::KalmanFilterBase::setR((Matrix *)&f);
  stateObservation::KalmanFilterBase::setQ((Matrix *)&f);
  for (lVar8 = 1; lVar8 != 0x3e9; lVar8 = lVar8 + 1) {
    stateObservation::ZeroDelayObserver::setMeasurement((Matrix *)&f,(long)local_a950);
    local_a950 = local_a950 + 1;
  }
  stateObservation::ZeroDelayObserver::getEstimatedState((long)local_a940);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)&v,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_a940,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(xk + 1000));
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&error,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&v);
  free(local_a940[0]);
  RVar10 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::norm
                     ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&error);
  free(error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(p.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(xh.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(u.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(q.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(r.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(q1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(r1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  lVar8 = 0x3e70;
  do {
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::~DenseStorage
              ((DenseStorage<double,__1,__1,_1,_0> *)
               ((long)&yk[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_data + lVar8));
    lVar8 = lVar8 + -0x10;
  } while (lVar8 != -0x10);
  lVar8 = 16000;
  do {
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::~DenseStorage
              ((DenseStorage<double,__1,__1,_1,_0> *)
               ((long)&xk[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_data + lVar8));
    lVar8 = lVar8 + -0x10;
  } while (lVar8 != -0x10);
  free(d.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(c.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(b.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  stateObservation::LinearKalmanFilter::~LinearKalmanFilter(&f);
  return RVar10;
}

Assistant:

double testKalmanFilterZeroInput()
{
  typedef stateObservation::LinearKalmanFilter filter;

  filter f(4, 3);
  Eigen::Matrix<double, 4, 4> a;

  a << -0.6785714, 0.1156463, 0.4392517, 0.2863946, 0.0865306, -0.0273810, 0.3355102, 0.0184150, -0.4172789, -0.2036735,
      -0.4434014, -0.2666667, 0.4200680, 0.5387075, 0.4883673, -0.598639;

  filter::Bmatrix b = f.getBmatrixRandom();
  filter::Cmatrix c = f.getCmatrixRandom();
  filter::Dmatrix d = f.getDmatrixRandom();

  const stateObservation::Index kmax = 1000;

  filter::StateVector xk[kmax + 1];
  filter::MeasureVector yk[kmax];

  filter::StateVector x = f.stateVectorZero();

  xk[0] = x;

  boost::lagged_fibonacci1279 gen_;

  filter::Rmatrix r1 = f.getRmatrixRandom() * 0.01;

  filter::Qmatrix q1 = f.getQmatrixRandom() * 0.01;

  filter::Rmatrix r(r1 * r1.transpose());
  filter::Qmatrix q(q1 * q1.transpose());

  filter::InputVector u = f.inputVectorZero();

  for(stateObservation::Index k = 1; k <= kmax; ++k)
  {

    filter::StateVector v = f.stateVectorZero();
    for(unsigned i = 0; i < f.getStateSize(); ++i)
    {
      boost::normal_distribution<> g(0, 1);
      v[i] = g(gen_);
    }
    v = q1 * v;

    filter::MeasureVector w = f.measureVectorZero();
    for(unsigned i = 0; i < f.getMeasureSize(); ++i)
    {
      boost::normal_distribution<> g(0, 1);
      w[i] = g(gen_);
    }
    w = r1 * w;

    xk[k] = x = a * x + v;
    yk[k - 1] = c * x + w;
  }

  filter::StateVector xh = f.stateVectorRandom();

  f.setState(xh, 0);

  filter::Pmatrix p = f.getPmatrixZero();

  for(unsigned i = 0; i < f.getStateSize(); ++i)
  {
    p(i, i) = xh[i];
  }
  p = p * p.transpose();

  f.setStateCovariance(p);

  f.setA(a);
  f.setB(b);
  f.setC(c);
  f.setD(d);

  f.setR(r);
  f.setQ(q);

  stateObservation::Index i;

  for(i = 1; i <= kmax; ++i)
  {
    f.setMeasurement(yk[i - 1], i);
  }

  filter::StateVector error = f.getEstimatedState(kmax) - xk[kmax];

  return error.norm();
}